

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O3

int __thiscall multicaldate_t::weekno(multicaldate_t *this,int weekday)

{
  int iVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  caldate_t jan1;
  caldate_t local_2c;
  
  iVar1 = (*this->_vptr_multicaldate_t[7])();
  caldate_t::set_dayno(&local_2c,iVar1);
  uVar3 = (uint)((long)local_2c.m < 3);
  iVar5 = local_2c.y - uVar3;
  iVar1 = (local_2c.y - uVar3) + 3;
  if (-1 < iVar5) {
    iVar1 = iVar5;
  }
  iVar4 = (int)((ulong)((long)iVar5 * -0x51eb851f) >> 0x20);
  iVar1 = iVar5 + local_2c.d + *(int *)("12julcaldate_t" + (long)local_2c.m * 4 + 0xd) +
          (iVar1 >> 2) + ((iVar4 >> 5) - (iVar4 >> 0x1f)) + iVar5 / 400;
  iVar1 = (iVar1 / 7) * 7 - iVar1;
  iVar4 = iVar1 + weekday;
  iVar1 = (int)((ulong)((long)(weekday + iVar1 + 7) * -0x6db6db6d) >> 0x20) + iVar4 + 7;
  iVar2 = caldate_t::dayno(&local_2c);
  iVar5 = (*this->_vptr_multicaldate_t[2])(this);
  iVar1 = iVar2 + ((iVar1 >> 2) - (iVar1 >> 0x1f)) * -7 + iVar4 + 7;
  iVar1 = (iVar5 - iVar1) + (int)((ulong)((long)((iVar5 - iVar1) + 7) * -0x6db6db6d) >> 0x20) + 7;
  return (iVar1 >> 2) - (iVar1 >> 0x1f);
}

Assistant:

int weekno(int weekday) const
    {
        /* 
         *   Figure days until the first <weekday> of the year: that's the
         *   start of week 1, so the day number of the start of week 1 is the
         *   jan1 day number plus this delta.  The start of week 0 is 7 days
         *   before that.
         */
        caldate_t jan1(jan1_dayno());
        int delta = (7 + weekday - jan1.weekday()) % 7;
        int week0_dayno = jan1.dayno() + delta - 7;

        /* figure which week we're in and return the result */
        return (dayno() - week0_dayno)/7;
    }